

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGhsMultiGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalGhsMultiGenerator::GetTargetDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalGhsMultiGenerator *this,cmGeneratorTarget *target)

{
  string *psVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  undefined8 local_18;
  char *local_10;
  
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  local_28._M_str = (psVar1->_M_dataplus)._M_p;
  local_28._M_len = psVar1->_M_string_length;
  local_18 = 4;
  local_10 = ".dir";
  views._M_len = 2;
  views._M_array = &local_28;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGhsMultiGenerator::GetTargetDirectory(
  cmGeneratorTarget const* target) const
{
  std::string dir = cmStrCat(target->GetName(), ".dir");
  return dir;
}